

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

U32 ZSTD_litLengthPrice(U32 litLength,optState_t *optPtr,int optLevel)

{
  byte bVar1;
  U32 UVar2;
  U32 UVar3;
  int iVar4;
  
  iVar4 = 0;
  while( true ) {
    if (0x20000 < litLength) {
      __assert_fail("litLength <= ZSTD_BLOCKSIZE_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x125,"U32 ZSTD_litLengthPrice(const U32, const optState_t *const, int)");
    }
    if (optPtr->priceType == zop_predef) break;
    if (litLength != 0x20000) {
      UVar3 = ZSTD_LLcode(litLength);
      bVar1 = ""[UVar3];
      UVar2 = optPtr->litLengthSumBasePrice;
      if (optLevel == 0) {
        UVar3 = ZSTD_bitWeight(optPtr->litLengthFreq[UVar3]);
      }
      else {
        UVar3 = ZSTD_fracWeight(optPtr->litLengthFreq[UVar3]);
      }
      UVar3 = ((uint)bVar1 * 0x100 + UVar2) - UVar3;
      goto LAB_005ccb4e;
    }
    iVar4 = iVar4 + 0x100;
    litLength = 0x1ffff;
  }
  if (optLevel == 0) {
    UVar3 = ZSTD_bitWeight(litLength);
  }
  else {
    UVar3 = ZSTD_fracWeight(litLength);
  }
LAB_005ccb4e:
  return UVar3 + iVar4;
}

Assistant:

static U32 ZSTD_litLengthPrice(U32 const litLength, const optState_t* const optPtr, int optLevel)
{
    assert(litLength <= ZSTD_BLOCKSIZE_MAX);
    if (optPtr->priceType == zop_predef)
        return WEIGHT(litLength, optLevel);

    /* ZSTD_LLcode() can't compute litLength price for sizes >= ZSTD_BLOCKSIZE_MAX
     * because it isn't representable in the zstd format.
     * So instead just pretend it would cost 1 bit more than ZSTD_BLOCKSIZE_MAX - 1.
     * In such a case, the block would be all literals.
     */
    if (litLength == ZSTD_BLOCKSIZE_MAX)
        return BITCOST_MULTIPLIER + ZSTD_litLengthPrice(ZSTD_BLOCKSIZE_MAX - 1, optPtr, optLevel);

    /* dynamic statistics */
    {   U32 const llCode = ZSTD_LLcode(litLength);
        return (LL_bits[llCode] * BITCOST_MULTIPLIER)
             + optPtr->litLengthSumBasePrice
             - WEIGHT(optPtr->litLengthFreq[llCode], optLevel);
    }
}